

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::dump(Dumper *this,Slice slice)

{
  long *plVar1;
  ValueLength VVar2;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  Slice *in_stack_00000160;
  Dumper *in_stack_00000168;
  Slice in_stack_00000170;
  
  *(undefined4 *)(in_RDI + 0x10) = 0;
  plVar1 = *(long **)(in_RDI + 8);
  VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(in_RDI);
  (**(code **)(*plVar1 + 0x20))(plVar1,VVar2);
  dumpValue(in_stack_00000168,in_stack_00000170,in_stack_00000160);
  return;
}

Assistant:

void Dumper::dump(Slice slice) {
  _indentation = 0;
  _sink->reserve(slice.byteSize());
  dumpValue(slice);
}